

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# colStrBuf.c
# Opt level: O1

size_t Col_StringBufferLength(Col_Word strbuf)

{
  uint uVar1;
  size_t sVar2;
  
  if (strbuf == 0) {
    uVar1 = 0;
  }
  else if ((strbuf & 0xf) == 0) {
    uVar1 = -(uint)((*(byte *)strbuf & 2) == 0) | *(byte *)strbuf & 0xfffffffe;
  }
  else {
    uVar1 = immediateWordTypes[(uint)strbuf & 0x1f];
  }
  if ((uVar1 == 2) && ((*(byte *)(strbuf + 2) & 0xc) == 0)) {
    strbuf = *(Col_Word *)(strbuf + 0x10);
  }
  sVar2 = Col_RopeLength(*(Col_Word *)(strbuf + 8));
  return sVar2 + *(long *)(strbuf + 0x10);
}

Assistant:

size_t
Col_StringBufferLength(
    Col_Word strbuf)    /*!< String buffer to get length for. */
{
    /*
     * Check preconditions.
     */

    /*! @typecheck{COL_ERROR_STRBUF,strbuf} */
    TYPECHECK_STRBUF(strbuf) return 0;

    WORD_UNWRAP(strbuf);

    /*
     * String buffer length is the cumulated string length plus the current
     * length of the character buffer.
     */

    return Col_RopeLength(WORD_STRBUF_ROPE(strbuf))
            + WORD_STRBUF_LENGTH(strbuf);
}